

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O0

void __thiscall caffe::ImageDataParameter::SharedCtor(ImageDataParameter *this)

{
  string *psVar1;
  ImageDataParameter *this_local;
  
  this->_cached_size_ = 0;
  psVar1 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  google::protobuf::internal::ArenaStringPtr::UnsafeSetDefault(&this->source_,psVar1);
  psVar1 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  google::protobuf::internal::ArenaStringPtr::UnsafeSetDefault(&this->mean_file_,psVar1);
  psVar1 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  google::protobuf::internal::ArenaStringPtr::UnsafeSetDefault(&this->root_folder_,psVar1);
  memset(&this->crop_size_,0,0x14);
  this->is_color_ = true;
  this->scale_ = 1.0;
  this->batch_size_ = 1;
  return;
}

Assistant:

void ImageDataParameter::SharedCtor() {
  _cached_size_ = 0;
  source_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  mean_file_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  root_folder_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  ::memset(&crop_size_, 0, reinterpret_cast<char*>(&new_width_) -
    reinterpret_cast<char*>(&crop_size_) + sizeof(new_width_));
  is_color_ = true;
  scale_ = 1;
  batch_size_ = 1u;
}